

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

bool __thiscall HttpContext::processRequestLine(HttpContext *this,char *begin,char *end)

{
  bool bVar1;
  char *__last1;
  char *version_end;
  char *local_48;
  char *question;
  char *local_38;
  char *space;
  char *start;
  char *pcStack_20;
  bool succeed;
  char *end_local;
  char *begin_local;
  HttpContext *this_local;
  
  start._7_1_ = 0;
  question._7_1_ = 0x20;
  space = begin;
  pcStack_20 = end;
  end_local = begin;
  begin_local = (char *)this;
  local_38 = std::find<char_const*,char>(begin,end,(char *)((long)&question + 7));
  if ((local_38 != pcStack_20) &&
     (bVar1 = HttpRequest::SetMethod(&this->_request,space,local_38), bVar1)) {
    space = local_38 + 1;
    question._6_1_ = 0x20;
    local_38 = std::find<char_const*,char>(space,pcStack_20,(char *)((long)&question + 6));
    if (local_38 != pcStack_20) {
      version_end._7_1_ = 0x3f;
      local_48 = std::find<char_const*,char>(space,local_38,(char *)((long)&version_end + 7));
      if (local_48 == local_38) {
        HttpRequest::SetPath(&this->_request,space,local_38);
      }
      else {
        HttpRequest::SetPath(&this->_request,space,local_48);
        HttpRequest::SetQuery(&this->_request,local_48,local_38);
      }
      space = local_38 + 1;
      __last1 = local_38 + 9;
      start._7_1_ = 1;
      bVar1 = std::equal<char_const*,char_const*>(space,__last1,"HTTP/1.1");
      if (bVar1) {
        HttpRequest::SetVersion(&this->_request,Http11);
      }
      else {
        bVar1 = std::equal<char_const*,char_const*>(space,__last1,"HTTP/1.0");
        if (bVar1) {
          HttpRequest::SetVersion(&this->_request,Http10);
        }
        else {
          start._7_1_ = 0;
        }
      }
    }
  }
  return (bool)(start._7_1_ & 1);
}

Assistant:

bool HttpContext::processRequestLine(const char* begin, const char* end) {
    bool succeed = false;
    const char* start = begin;
    const char* space = std::find(start, end, ' ');
    if (space != end && _request.SetMethod(start, space)) {
        start = space + 1;
        space = std::find(start, end, ' ');
        if (space != end) {
            const char* question = std::find(start, space, '?');
            if (question != space) {
                _request.SetPath(start, question);
                _request.SetQuery(question, space);

            } else {
                _request.SetPath(start, space);
            }

            start = space + 1;
            const char* version_end = start + VERSION_LEN - 1;
            succeed = true;
            if (std::equal(start, version_end, "HTTP/1.1")) {
                _request.SetVersion(Http11);

            } else if (std::equal(start, version_end, "HTTP/1.0")) {
                _request.SetVersion(Http10);

            } else {
                succeed = false;
            }
        }
    }
    return succeed;
}